

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O3

int dwarf_get_macro_context_by_offset
              (Dwarf_Die cu_die,Dwarf_Unsigned offset,Dwarf_Unsigned *version_out,
              Dwarf_Macro_Context *macro_context,Dwarf_Unsigned *macro_ops_count_out,
              Dwarf_Unsigned *macro_ops_data_length,Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Unsigned local_8;
  
  iVar1 = _dwarf_internal_macro_context
                    (cu_die,1,offset,version_out,macro_context,&local_8,macro_ops_count_out,
                     macro_ops_data_length,error);
  return iVar1;
}

Assistant:

int
dwarf_get_macro_context_by_offset(Dwarf_Die cu_die,
    Dwarf_Unsigned offset,
    Dwarf_Unsigned      * version_out,
    Dwarf_Macro_Context * macro_context,
    Dwarf_Unsigned      * macro_ops_count_out,
    Dwarf_Unsigned      * macro_ops_data_length,
    Dwarf_Error * error)
{
    int res = 0;
    Dwarf_Bool offset_specified = TRUE;
    Dwarf_Unsigned macro_unit_offset_out = 0;

    res = _dwarf_internal_macro_context(cu_die,
        offset_specified,
        offset,
        version_out,
        macro_context,
        &macro_unit_offset_out,
        macro_ops_count_out,
        macro_ops_data_length,
        error);
    return res;
}